

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deBool deSocket_shutdown(deSocket *sock,deUint32 channels)

{
  int iVar1;
  int *piVar2;
  int local_24;
  uint local_20;
  int how;
  deUint32 closedChannels;
  deUint32 channels_local;
  deSocket *sock_local;
  
  deMutex_lock(sock->stateLock);
  if ((sock->state == DE_SOCKETSTATE_DISCONNECTED) || (sock->state == DE_SOCKETSTATE_CLOSED)) {
    deMutex_unlock(sock->stateLock);
    sock_local._4_4_ = 0;
  }
  else {
    local_20 = sock->openChannels & channels;
    if (local_20 == 0) {
      deMutex_unlock(sock->stateLock);
      sock_local._4_4_ = 0;
    }
    else {
      if ((local_20 & 3) == 3) {
        local_24 = 2;
      }
      else if ((local_20 & 2) == 0) {
        local_24 = 0;
      }
      else {
        local_24 = 1;
      }
      iVar1 = shutdown(sock->handle,local_24);
      if (iVar1 != 0) {
        piVar2 = __errno_location();
        if (*piVar2 != 0x6b) {
          deMutex_unlock(sock->stateLock);
          return 0;
        }
        local_20 = 3;
      }
      sock->openChannels = sock->openChannels & (local_20 ^ 0xffffffff);
      if (sock->openChannels == 0) {
        sock->state = DE_SOCKETSTATE_DISCONNECTED;
      }
      deMutex_unlock(sock->stateLock);
      sock_local._4_4_ = 1;
    }
  }
  return sock_local._4_4_;
}

Assistant:

deBool deSocket_shutdown (deSocket* sock, deUint32 channels)
{
	deUint32 closedChannels = 0;

	deMutex_lock(sock->stateLock);

	if (sock->state == DE_SOCKETSTATE_DISCONNECTED ||
		sock->state == DE_SOCKETSTATE_CLOSED)
	{
		deMutex_unlock(sock->stateLock);
		return DE_FALSE;
	}

	DE_ASSERT(channels != 0 && (channels & ~(deUint32)DE_SOCKETCHANNEL_BOTH) == 0);

	/* Don't attempt to close already closed channels on partially open socket. */
	channels &= sock->openChannels;

	if (channels == 0)
	{
		deMutex_unlock(sock->stateLock);
		return DE_FALSE;
	}

#if defined(DE_USE_WINSOCK)
	{
		int how = 0;

		if ((channels & DE_SOCKETCHANNEL_BOTH) == DE_SOCKETCHANNEL_BOTH)
			how = SD_BOTH;
		else if (channels & DE_SOCKETCHANNEL_SEND)
			how = SD_SEND;
		else if (channels & DE_SOCKETCHANNEL_RECEIVE)
			how = SD_RECEIVE;

		if (shutdown(sock->handle, how) == 0)
			closedChannels = channels;
		else
		{
			int err = WSAGetLastError();

			/* \note Due to asynchronous behavior certain errors are perfectly ok. */
			if (err == WSAECONNABORTED || err == WSAECONNRESET || err == WSAENOTCONN)
				closedChannels = DE_SOCKETCHANNEL_BOTH;
			else
			{
				deMutex_unlock(sock->stateLock);
				return DE_FALSE;
			}
		}
	}
#else
	{
		int how = 0;

		if ((channels & DE_SOCKETCHANNEL_BOTH) == DE_SOCKETCHANNEL_BOTH)
			how = SHUT_RDWR;
		else if (channels & DE_SOCKETCHANNEL_SEND)
			how = SHUT_WR;
		else if (channels & DE_SOCKETCHANNEL_RECEIVE)
			how = SHUT_RD;

		if (shutdown(sock->handle, how) == 0)
			closedChannels = channels;
		else
		{
			if (errno == ENOTCONN)
				closedChannels = DE_SOCKETCHANNEL_BOTH;
			else
			{
				deMutex_unlock(sock->stateLock);
				return DE_FALSE;
			}
		}
	}
#endif

	sock->openChannels &= ~closedChannels;
	if (sock->openChannels == 0)
		sock->state = DE_SOCKETSTATE_DISCONNECTED;

	deMutex_unlock(sock->stateLock);
	return DE_TRUE;
}